

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O1

psa_status_t
psa_start_key_creation
          (psa_key_creation_method_t method,psa_key_attributes_t *attributes,
          psa_key_handle_t *handle,psa_key_slot_t **p_slot,psa_se_drv_table_entry_t **p_drv)

{
  undefined8 *puVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  undefined4 in_register_0000003c;
  undefined8 *puVar6;
  
  puVar6 = (undefined8 *)CONCAT44(in_register_0000003c,method);
  *p_slot = (psa_key_slot_t *)0x0;
  if ((((*(psa_key_lifetime_t *)((long)puVar6 + 4) == 0) ||
       (iVar5 = psa_validate_persistent_key_parameters
                          (*(psa_key_lifetime_t *)((long)puVar6 + 4),
                           *(psa_key_file_id_t *)(puVar6 + 1),(psa_se_drv_table_entry_t **)p_slot,1)
       , iVar5 == 0)) && (iVar5 = -0x87, (*(uint *)((long)puVar6 + 0xc) & 0xffffe0fc) == 0)) &&
     ((iVar5 = -0x86, *(ushort *)((long)puVar6 + 2) < 0xfff9 &&
      (iVar5 = -0x87, *(ushort *)(puVar6 + 3) < 2)))) {
    iVar5 = 0;
  }
  if ((iVar5 == 0) &&
     (iVar5 = psa_get_empty_key_slot((psa_key_handle_t *)attributes,(psa_key_slot_t **)handle),
     iVar5 == 0)) {
    puVar1 = *(undefined8 **)handle;
    uVar2 = *puVar6;
    uVar3 = puVar6[1];
    uVar4 = *(undefined8 *)((long)puVar6 + 0x14);
    *(undefined8 *)((long)puVar1 + 0xc) = *(undefined8 *)((long)puVar6 + 0xc);
    *(undefined8 *)((long)puVar1 + 0x14) = uVar4;
    *puVar1 = uVar2;
    puVar1[1] = uVar3;
    *(byte *)(puVar1 + 3) = *(byte *)(puVar1 + 3) & 0xfe;
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static psa_status_t psa_start_key_creation(
    psa_key_creation_method_t method,
    const psa_key_attributes_t *attributes,
    psa_key_handle_t *handle,
    psa_key_slot_t **p_slot,
    psa_se_drv_table_entry_t **p_drv )
{
    psa_status_t status;
    psa_key_slot_t *slot;

    (void) method;
    *p_drv = NULL;

    status = psa_validate_key_attributes( attributes, p_drv );
    if( status != PSA_SUCCESS )
        return( status );

    status = psa_get_empty_key_slot( handle, p_slot );
    if( status != PSA_SUCCESS )
        return( status );
    slot = *p_slot;

    /* We're storing the declared bit-size of the key. It's up to each
     * creation mechanism to verify that this information is correct.
     * It's automatically correct for mechanisms that use the bit-size as
     * an input (generate, device) but not for those where the bit-size
     * is optional (import, copy). */

    slot->attr = attributes->core;

    /* Erase external-only flags from the internal copy. To access
     * external-only flags, query `attributes`. Thanks to the check
     * in psa_validate_key_attributes(), this leaves the dual-use
     * flags and any internal flag that psa_get_empty_key_slot()
     * may have set. */
    slot->attr.flags &= ~MBEDTLS_PSA_KA_MASK_EXTERNAL_ONLY;

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    /* For a key in a secure element, we need to do three things
     * when creating or registering a key:
     * create the key file in internal storage, create the
     * key inside the secure element, and update the driver's
     * persistent data. Start a transaction that will encompass these
     * three actions. */
    /* The first thing to do is to find a slot number for the new key.
     * We save the slot number in persistent storage as part of the
     * transaction data. It will be needed to recover if the power
     * fails during the key creation process, to clean up on the secure
     * element side after restarting. Obtaining a slot number from the
     * secure element driver updates its persistent state, but we do not yet
     * save the driver's persistent state, so that if the power fails,
     * we can roll back to a state where the key doesn't exist. */
    if( *p_drv != NULL )
    {
        status = psa_find_se_slot_for_key( attributes, method, *p_drv,
                                           &slot->data.se.slot_number );
        if( status != PSA_SUCCESS )
            return( status );
        psa_crypto_prepare_transaction( PSA_CRYPTO_TRANSACTION_CREATE_KEY );
        psa_crypto_transaction.key.lifetime = slot->attr.lifetime;
        psa_crypto_transaction.key.slot = slot->data.se.slot_number;
        psa_crypto_transaction.key.id = slot->attr.id;
        status = psa_crypto_save_transaction( );
        if( status != PSA_SUCCESS )
        {
            (void) psa_crypto_stop_transaction( );
            return( status );
        }
    }

    if( *p_drv == NULL && method == PSA_KEY_CREATION_REGISTER )
    {
        /* Key registration only makes sense with a secure element. */
        return( PSA_ERROR_INVALID_ARGUMENT );
    }
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    return( status );
}